

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.h
# Opt level: O2

uint128 absl::lts_20240722::operator*(uint128 lhs,uint128 rhs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint128 uVar3;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = rhs.lo_;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = lhs.lo_;
  uVar3.lo_ = SUB168(auVar1 * auVar2,0);
  uVar3.hi_ = SUB168(auVar1 * auVar2,8) + lhs.hi_ * rhs.lo_ + rhs.hi_ * lhs.lo_;
  return uVar3;
}

Assistant:

inline uint128 operator*(uint128 lhs, uint128 rhs) {
#if defined(ABSL_HAVE_INTRINSIC_INT128)
  // TODO(strel) Remove once alignment issues are resolved and unsigned __int128
  // can be used for uint128 storage.
  return static_cast<unsigned __int128>(lhs) *
         static_cast<unsigned __int128>(rhs);
#elif defined(_MSC_VER) && defined(_M_X64) && !defined(_M_ARM64EC)
  uint64_t carry;
  uint64_t low = _umul128(Uint128Low64(lhs), Uint128Low64(rhs), &carry);
  return MakeUint128(Uint128Low64(lhs) * Uint128High64(rhs) +
                         Uint128High64(lhs) * Uint128Low64(rhs) + carry,
                     low);
#else   // ABSL_HAVE_INTRINSIC128
  uint64_t a32 = Uint128Low64(lhs) >> 32;
  uint64_t a00 = Uint128Low64(lhs) & 0xffffffff;
  uint64_t b32 = Uint128Low64(rhs) >> 32;
  uint64_t b00 = Uint128Low64(rhs) & 0xffffffff;
  uint128 result =
      MakeUint128(Uint128High64(lhs) * Uint128Low64(rhs) +
                      Uint128Low64(lhs) * Uint128High64(rhs) + a32 * b32,
                  a00 * b00);
  result += uint128(a32 * b00) << 32;
  result += uint128(a00 * b32) << 32;
  return result;
#endif  // ABSL_HAVE_INTRINSIC128
}